

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O0

rgba_vec_t *
sfc::unpack_native_colors(rgba_vec_t *__return_storage_ptr__,byte_vec_t *colors,Mode mode)

{
  byte bVar1;
  byte bVar2;
  value_type vVar3;
  ulong uVar4;
  byte *pbVar5;
  size_type sVar6;
  runtime_error *prVar7;
  const_reference pvVar8;
  value_type_conflict3 local_9c;
  ushort local_96;
  rgba_t nc_6;
  value_type_conflict3 vStack_90;
  uint16_t cw_5;
  uint i_9;
  rgba_t nc_5;
  uint uStack_84;
  uint16_t cw_4;
  uint i_8;
  uint32_t c_1;
  rgba_t rgba_2;
  uint i_7;
  uint32_t c;
  rgba_t rgba_1;
  uint i_6;
  rgba_t nc_4;
  value_type_conflict3 vStack_60;
  uint16_t cw_3;
  uint i_5;
  rgba_t nc_3;
  value_type_conflict3 vStack_54;
  uint16_t cw_2;
  uint i_4;
  rgba_t nc_2;
  value_type_conflict3 vStack_48;
  uint16_t cw_1;
  uint i_3;
  rgba_t rgba;
  uint i_2;
  rgba_t nc_1;
  uint i_1;
  rgba_t nc;
  uint16_t cw;
  uint i;
  undefined1 local_1d;
  Mode local_1c;
  byte_vec_t *pbStack_18;
  Mode mode_local;
  byte_vec_t *colors_local;
  rgba_vec_t *v;
  
  local_1d = 0;
  local_1c = mode;
  pbStack_18 = colors;
  colors_local = (byte_vec_t *)__return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  switch(local_1c) {
  case none:
    break;
  case snes:
  case snes_mode7:
  case gbc:
  case gba:
  case gba_affine:
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18);
    if ((sVar6 & 1) != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"native palette size not a multiple of 2");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (nc = 0; uVar4 = (ulong)nc,
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18),
        uVar4 < sVar6; nc = nc + 2) {
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)(nc + 1));
      vVar3 = *pvVar8;
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)nc);
      i_1._2_2_ = CONCAT11(vVar3,*pvVar8);
      nc_1 = (i_1._2_2_ & 0x7c00) * 0x40 + -0x1000000 + (i_1._2_2_ & 0x1f) + (i_1._2_2_ & 0x3e0) * 8
      ;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&nc_1);
    }
    break;
  case gb:
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18);
    if (sVar6 != 1) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"native palette size not one byte");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (i_3 = 0; i_3 < 4; i_3 = i_3 + 1) {
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pbStack_18,0);
      switch(*pbVar5 >> ((char)i_3 * '\x02' & 0x1fU) & 3) {
      case 0:
        vStack_48 = 0xff030303;
        break;
      case 1:
        vStack_48 = 0xff020202;
        break;
      case 2:
        vStack_48 = 0xff010101;
        break;
      case 3:
        vStack_48 = 0xff000000;
        break;
      default:
        vStack_48 = 0;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&stack0xffffffffffffffb8);
    }
    break;
  case md:
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18);
    if ((sVar6 & 1) != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"native palette size not a multiple of 2");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (nc_3 = 0; uVar4 = (ulong)nc_3,
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18),
        uVar4 < sVar6; nc_3 = nc_3 + 2) {
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)(nc_3 + 1));
      vVar3 = *pvVar8;
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)nc_3);
      i_5._2_2_ = CONCAT11(vVar3,*pvVar8);
      vStack_60 = (i_5._2_2_ & 0xe00) * 0x80 + -0x1000000 +
                  ((i_5._2_2_ & 0xe) >> 1) + (i_5._2_2_ & 0xe0) * 8;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&stack0xffffffffffffffa0);
    }
    break;
  case pce:
  case pce_sprite:
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18);
    if ((sVar6 & 1) != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"native palette size not a multiple of 2");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (nc_4 = 0; uVar4 = (ulong)nc_4,
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18),
        uVar4 < sVar6; nc_4 = nc_4 + 2) {
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)(nc_4 + 1));
      vVar3 = *pvVar8;
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)nc_4);
      i_6._2_2_ = CONCAT11(vVar3,*pvVar8);
      rgba_1 = (i_6._2_2_ & 0x1c00) * 0x400 + -0x1000000 +
               ((i_6._2_2_ & 0x38) >> 3 | (i_6._2_2_ & 7) << 8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&rgba_1);
    }
    break;
  case ws:
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18);
    if (sVar6 != 2) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"native palette size not two bytes");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (c = 0; c < 4; c = c + 1) {
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)(c >> 1));
      rgba_2 = *pbVar5 >> (((byte)c & 1) << 2) & 7;
      i_7 = (rgba_2 ^ 7) * 0x10101 | 0xff000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&i_7);
    }
    break;
  case wsc:
  case wsc_packed:
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18);
    if ((sVar6 & 1) != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"native palette size not a multiple of 2");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (nc_5 = 0; uVar4 = (ulong)nc_5,
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18),
        uVar4 < sVar6; nc_5 = nc_5 + 2) {
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)(nc_5 + 1));
      bVar1 = *pbVar5;
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)nc_5);
      i_9._2_2_ = CONCAT11(bVar1,*pvVar8);
      vStack_90 = (i_9._2_2_ & 0xf) * 0x10000 + -0x1000000 + (bVar1 & 0xf | (i_9._2_2_ & 0xf0) << 4)
      ;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&stack0xffffffffffffff70);
    }
    break;
  case ngp:
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18);
    if (sVar6 != 4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"native palette size not four bytes");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (c_1 = 0; c_1 < 4; c_1 = c_1 + 1) {
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)c_1);
      uStack_84 = *pbVar5 & 7;
      i_8 = (uStack_84 ^ 7) * 0x10101 | 0xff000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&i_8);
    }
    break;
  case ngpc:
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18);
    if ((sVar6 & 1) != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"native palette size not a multiple of 2");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (nc_6 = 0; uVar4 = (ulong)nc_6,
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18),
        uVar4 < sVar6; nc_6 = nc_6 + 2) {
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)(nc_6 + 1));
      vVar3 = *pvVar8;
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)nc_6);
      local_96 = CONCAT11(vVar3,*pvVar8);
      local_9c = (local_96 & 0xf00) * 0x100 + -0x1000000 + (local_96 & 0xf | (local_96 & 0xf0) << 4)
      ;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&local_9c);
    }
    break;
  case sms:
    for (i_2 = 0; uVar4 = (ulong)i_2,
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18),
        uVar4 < sVar6; i_2 = i_2 + 1) {
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)i_2);
      bVar1 = *pbVar5;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)i_2);
      bVar2 = *pbVar5;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)i_2);
      rgba = (*pbVar5 & 0x30) * 0x1000 + -0x1000000 + (bVar1 & 3 | (bVar2 & 0xc) << 6);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&rgba);
    }
    break;
  case gg:
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18);
    if ((sVar6 & 1) != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"native palette size not a multiple of 2");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (nc_2 = 0; uVar4 = (ulong)nc_2,
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pbStack_18),
        uVar4 < sVar6; nc_2 = nc_2 + 2) {
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)(nc_2 + 1));
      vVar3 = *pvVar8;
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pbStack_18,(ulong)nc_2);
      i_4._2_2_ = CONCAT11(vVar3,*pvVar8);
      vStack_54 = (i_4._2_2_ & 0xf00) * 0x100 + -0x1000000 +
                  (i_4._2_2_ & 0xf | (i_4._2_2_ & 0xf0) << 4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&stack0xffffffffffffffac);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline rgba_vec_t unpack_native_colors(const byte_vec_t& colors, Mode mode) {
  rgba_vec_t v;
  switch (mode) {
  case Mode::snes:
  case Mode::snes_mode7:
  case Mode::gbc:
  case Mode::gba:
  case Mode::gba_affine:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = (cw & 0x001f) | ((cw & 0x03e0) << 3) | ((cw & 0x7c00) << 6) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::sms:
    for (unsigned i = 0; i < colors.size(); i++) {
      rgba_t nc = (colors[i] & 3) | ((colors[i] & 0xC) << 6) | ((colors[i] & 0x30) << 12) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::gb:
    if (colors.size() != 1) {
      throw std::runtime_error("native palette size not one byte");
    }
    for (unsigned i = 0; i < 4; ++i) {
      rgba_t rgba;
      switch ((colors[0] >> (i * 2)) & 0x3) {
        case 0: rgba = 0xff030303; break;
        case 1: rgba = 0xff020202; break;
        case 2: rgba = 0xff010101; break;
        case 3: rgba = 0xff000000; break;
        default:
          rgba = 0;
      }
      v.push_back(rgba);
    }
    break;
  case Mode::gg:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = (cw & 0x00f) | ((cw & 0x00f0) << 4) | ((cw & 0x0f00) << 8) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::md:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = ((cw & 0x00e) >> 1) | ((cw & 0x00e0) << 3) | ((cw & 0x0e00) << 7) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::pce:
  case Mode::pce_sprite:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = ((cw & 0x0038) >> 3) | ((cw & 0x0007) << 8) | ((cw & 0x1c00) << 10) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::ws:
    // TODO: WonderSwan technically supports 8 out of 16 gray shades.
    // Currently, we do not support this additional distinction.
    if (colors.size() != 2) {
      throw std::runtime_error("native palette size not two bytes");
    }
    for (unsigned i = 0; i < 4; ++i) {
      rgba_t rgba;
      uint32_t c = (colors[i >> 1] >> ((i & 0x01) * 4)) & 0x7;
      rgba = 0xff000000 | ((c ^ 0x7) * 0x10101);
      v.push_back(rgba);
    }
    break;
  case Mode::ngp:
    if (colors.size() != 4) {
      throw std::runtime_error("native palette size not four bytes");
    }
    for (unsigned i = 0; i < 4; ++i) {
      rgba_t rgba;
      uint32_t c = colors[i] & 0x7;
      rgba = 0xff000000 | ((c ^ 0x7) * 0x10101);
      v.push_back(rgba);
    }
    break;
  case Mode::wsc:
  case Mode::wsc_packed:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = 0xff000000 | ((cw & 0xf00) >> 8) | ((cw & 0xf0) << 4) | ((cw & 0xf) << 16);
      v.push_back(nc);
    }
    break;
  case Mode::ngpc:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = 0xff000000 | (cw & 0xf) | ((cw & 0xf0) << 4) | ((cw & 0xf00) << 8);
      v.push_back(nc);
    }
    break;
  case Mode::none:
    break;
  }
  return v;
}